

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.h
# Opt level: O1

Gauge * __thiscall
prometheus::Family<prometheus::Gauge>::Add<>(Family<prometheus::Gauge> *this,Labels *labels)

{
  Gauge *pGVar1;
  pointer *__ptr;
  __uniq_ptr_impl<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>
  .super__Head_base<0UL,_prometheus::Gauge_*,_false>._M_head_impl =
       (tuple<prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>)operator_new(8);
  *(undefined8 *)
   local_18._M_t.
   super__Tuple_impl<0UL,_prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>.
   super__Head_base<0UL,_prometheus::Gauge_*,_false>._M_head_impl = 0;
  pGVar1 = Add(this,labels,
               (unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_> *)&local_18);
  if ((_Tuple_impl<0UL,_prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>.
      super__Head_base<0UL,_prometheus::Gauge_*,_false>._M_head_impl != (Gauge *)0x0) {
    operator_delete((void *)local_18._M_t.
                            super__Tuple_impl<0UL,_prometheus::Gauge_*,_std::default_delete<prometheus::Gauge>_>
                            .super__Head_base<0UL,_prometheus::Gauge_*,_false>._M_head_impl);
  }
  return pGVar1;
}

Assistant:

T& Add(const Labels& labels, Args&&... args) {
    return Add(labels, detail::make_unique<T>(args...));
  }